

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O0

FIOBJ fiobj_ary_alloc(size_t capa)

{
  void *__dest;
  int *piVar1;
  undefined1 local_40 [4];
  undefined4 local_3c;
  void *local_18;
  fiobj_ary_s *ary;
  size_t capa_local;
  
  ary = (fiobj_ary_s *)capa;
  __dest = fio_malloc(0x28);
  local_18 = __dest;
  if (__dest == (void *)0x0) {
    perror("ERROR: fiobj array couldn\'t allocate memory");
    piVar1 = __errno_location();
    exit(*piVar1);
  }
  memset(local_40,0,0x28);
  local_40[0] = 0x29;
  local_3c = 1;
  memcpy(__dest,local_40,0x28);
  if (ary != (fiobj_ary_s *)0x0) {
    fio_ary_____require_on_top((fio_ary___s *)((long)local_18 + 8),(size_t)ary);
  }
  return (FIOBJ)local_18;
}

Assistant:

static inline FIOBJ fiobj_ary_alloc(size_t capa) {
  fiobj_ary_s *ary = fio_malloc(sizeof(*ary));
  if (!ary) {
    perror("ERROR: fiobj array couldn't allocate memory");
    exit(errno);
  }
  *ary = (fiobj_ary_s){
      .head =
          {
              .ref = 1,
              .type = FIOBJ_T_ARRAY,
          },
  };
  if (capa)
    fio_ary_____require_on_top(&ary->ary, capa);
  return (FIOBJ)ary;
}